

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O3

void Abc_NtkCollectHie_rec(Abc_Ntk_t *pNtk,Vec_Ptr_t *vModels)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *__ptr;
  void **ppvVar3;
  long lVar4;
  
  if (-1 < pNtk->iStep) {
    return;
  }
  __ptr = Abc_NtkDfsBoxes(pNtk);
  iVar1 = __ptr->nSize;
  ppvVar3 = __ptr->pArray;
  if ((long)iVar1 < 1) {
    if (ppvVar3 == (void **)0x0) goto LAB_00867567;
  }
  else {
    lVar4 = 0;
    do {
      uVar2 = *(uint *)((long)ppvVar3[lVar4] + 0x14);
      if (((uVar2 & 0xe) == 8 || (uVar2 & 0xf) == 10) &&
         (pNtk_00 = *(Abc_Ntk_t **)((long)ppvVar3[lVar4] + 0x38), pNtk_00 != pNtk)) {
        Abc_NtkCollectHie_rec(pNtk_00,vModels);
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  free(ppvVar3);
LAB_00867567:
  free(__ptr);
  uVar2 = vModels->nSize;
  pNtk->iStep = uVar2;
  if (uVar2 == vModels->nCap) {
    if ((int)uVar2 < 0x10) {
      if (vModels->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vModels->pArray,0x80);
      }
      vModels->pArray = ppvVar3;
      vModels->nCap = 0x10;
    }
    else {
      if (vModels->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vModels->pArray,(ulong)uVar2 << 4);
      }
      vModels->pArray = ppvVar3;
      vModels->nCap = uVar2 * 2;
    }
  }
  else {
    ppvVar3 = vModels->pArray;
  }
  iVar1 = vModels->nSize;
  vModels->nSize = iVar1 + 1;
  ppvVar3[iVar1] = pNtk;
  return;
}

Assistant:

void Abc_NtkCollectHie_rec( Abc_Ntk_t * pNtk, Vec_Ptr_t * vModels )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    int i;
    if ( pNtk->iStep >= 0 )
        return;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Abc_NtkCollectHie_rec( (Abc_Ntk_t *)pObj->pData, vModels );
    Vec_PtrFree( vOrder );
    pNtk->iStep = Vec_PtrSize(vModels);
    Vec_PtrPush( vModels, pNtk );
}